

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

CharReader * __thiscall Json::CharReaderBuilder::newCharReader(CharReaderBuilder *this)

{
  bool collectComments;
  bool bVar1;
  Value *pVVar2;
  OurCharReader *this_00;
  Value *this_01;
  OurFeatures local_28;
  
  this_01 = &this->settings_;
  pVVar2 = Value::operator[](this_01,"collectComments");
  collectComments = Value::asBool(pVVar2);
  local_28.allowComments_ = true;
  local_28.strictRoot_ = false;
  local_28.allowDroppedNullPlaceholders_ = false;
  local_28.allowNumericKeys_ = false;
  local_28.allowSingleQuotes_ = false;
  local_28.failIfExtra_ = false;
  local_28.rejectDupKeys_ = false;
  local_28._7_1_ = 0;
  pVVar2 = Value::operator[](this_01,"allowComments");
  bVar1 = Value::asBool(pVVar2);
  local_28.allowComments_ = bVar1;
  pVVar2 = Value::operator[](this_01,"strictRoot");
  bVar1 = Value::asBool(pVVar2);
  local_28.strictRoot_ = bVar1;
  pVVar2 = Value::operator[](this_01,"allowDroppedNullPlaceholders");
  bVar1 = Value::asBool(pVVar2);
  local_28.allowDroppedNullPlaceholders_ = bVar1;
  pVVar2 = Value::operator[](this_01,"allowNumericKeys");
  bVar1 = Value::asBool(pVVar2);
  local_28.allowNumericKeys_ = bVar1;
  pVVar2 = Value::operator[](this_01,"allowSingleQuotes");
  bVar1 = Value::asBool(pVVar2);
  local_28.allowSingleQuotes_ = bVar1;
  pVVar2 = Value::operator[](this_01,"stackLimit");
  local_28.stackLimit_ = Value::asInt(pVVar2);
  pVVar2 = Value::operator[](this_01,"failIfExtra");
  bVar1 = Value::asBool(pVVar2);
  local_28.failIfExtra_ = bVar1;
  pVVar2 = Value::operator[](this_01,"rejectDupKeys");
  bVar1 = Value::asBool(pVVar2);
  local_28.rejectDupKeys_ = bVar1;
  this_00 = (OurCharReader *)operator_new(0x130);
  OurCharReader::OurCharReader(this_00,collectComments,&local_28);
  return &this_00->super_CharReader;
}

Assistant:

CharReader* CharReaderBuilder::newCharReader() const
{
  bool collectComments = settings_["collectComments"].asBool();
  OurFeatures features = OurFeatures::all();
  features.allowComments_ = settings_["allowComments"].asBool();
  features.strictRoot_ = settings_["strictRoot"].asBool();
  features.allowDroppedNullPlaceholders_ = settings_["allowDroppedNullPlaceholders"].asBool();
  features.allowNumericKeys_ = settings_["allowNumericKeys"].asBool();
  features.allowSingleQuotes_ = settings_["allowSingleQuotes"].asBool();
  features.stackLimit_ = settings_["stackLimit"].asInt();
  features.failIfExtra_ = settings_["failIfExtra"].asBool();
  features.rejectDupKeys_ = settings_["rejectDupKeys"].asBool();
  return new OurCharReader(collectComments, features);
}